

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SequenceFeatureType::MergeFrom
          (SequenceFeatureType *this,SequenceFeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  SizeRange *this_00;
  Int64FeatureType *this_01;
  Int64FeatureType *from_00;
  StringFeatureType *this_02;
  StringFeatureType *from_01;
  SizeRange *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/FeatureTypes.pb.cc"
               ,0x1040);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) &&
     (from->sizerange_ != (SizeRange *)0x0)) {
    this_00 = mutable_sizerange(this);
    from_02 = from->sizerange_;
    if (from_02 == (SizeRange *)0x0) {
      from_02 = (SizeRange *)&_SizeRange_default_instance_;
    }
    SizeRange::MergeFrom(this_00,from_02);
  }
  if (from->_oneof_case_[0] == 3) {
    this_02 = mutable_stringtype(this);
    from_01 = stringtype(from);
    StringFeatureType::MergeFrom(this_02,from_01);
  }
  else if (from->_oneof_case_[0] == 1) {
    this_01 = mutable_int64type(this);
    from_00 = int64type(from);
    Int64FeatureType::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

void SequenceFeatureType::MergeFrom(const SequenceFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SequenceFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_sizerange()) {
    mutable_sizerange()->::CoreML::Specification::SizeRange::MergeFrom(from.sizerange());
  }
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}